

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rpc_request.cc
# Opt level: O0

string * get_utc_string_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  tm *timenow;
  time_t now;
  string *res;
  
  timenow = (tm *)time((time_t *)&timenow);
  ptVar1 = gmtime((time_t *)&timenow);
  get_format_string_abi_cxx11_
            (in_RDI,"%d-%02d-%02dT%02d:%02d:%02dZ",(ulong)(ptVar1->tm_year + 0x76c),
             (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
             ptVar1->tm_min,ptVar1->tm_sec);
  return in_RDI;
}

Assistant:

static std::string get_utc_string() {
  time_t now;
  struct tm *timenow;
  now = time(&now);
  timenow = gmtime(&now);
  std::string res=  get_format_string("%d-%02d-%02dT%02d:%02d:%02dZ", timenow->tm_year + 1900,
                           timenow->tm_mon + 1,
                           timenow->tm_mday,
                           timenow->tm_hour,
                           timenow->tm_min,
                           timenow->tm_sec);
  return res;
}